

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5ExprPhraseFree(Fts5ExprPhrase *pPhrase)

{
  Fts5ExprTerm *pFVar1;
  long lVar2;
  Fts5ExprTerm *p;
  
  if (pPhrase != (Fts5ExprPhrase *)0x0) {
    for (lVar2 = 0; lVar2 < pPhrase->nTerm; lVar2 = lVar2 + 1) {
      sqlite3_free(pPhrase->aTerm[lVar2].zTerm);
      sqlite3Fts5IterClose(pPhrase->aTerm[lVar2].pIter);
      p = pPhrase->aTerm[lVar2].pSynonym;
      while (p != (Fts5ExprTerm *)0x0) {
        pFVar1 = p->pSynonym;
        sqlite3Fts5IterClose(p->pIter);
        sqlite3Fts5BufferFree((Fts5Buffer *)(p + 1));
        sqlite3_free(p);
        p = pFVar1;
      }
    }
    if (0 < (pPhrase->poslist).nSpace) {
      sqlite3Fts5BufferFree(&pPhrase->poslist);
    }
    sqlite3_free(pPhrase);
    return;
  }
  return;
}

Assistant:

static void fts5ExprPhraseFree(Fts5ExprPhrase *pPhrase){
  if( pPhrase ){
    int i;
    for(i=0; i<pPhrase->nTerm; i++){
      Fts5ExprTerm *pSyn;
      Fts5ExprTerm *pNext;
      Fts5ExprTerm *pTerm = &pPhrase->aTerm[i];
      sqlite3_free(pTerm->zTerm);
      sqlite3Fts5IterClose(pTerm->pIter);
      for(pSyn=pTerm->pSynonym; pSyn; pSyn=pNext){
        pNext = pSyn->pSynonym;
        sqlite3Fts5IterClose(pSyn->pIter);
        fts5BufferFree((Fts5Buffer*)&pSyn[1]);
        sqlite3_free(pSyn);
      }
    }
    if( pPhrase->poslist.nSpace>0 ) fts5BufferFree(&pPhrase->poslist);
    sqlite3_free(pPhrase);
  }
}